

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

var __thiscall
cs::domain_manager::get_var_optimizable<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  var *pvVar4;
  var_id *in_RDX;
  proxy *ppVar5;
  long lVar6;
  long lVar7;
  
  lVar2 = (long)(*(long *)((long)&(name->m_id).field_2 + 8) -
                (name->m_id).field_2._M_allocated_capacity) / 0x60;
  if (lVar2 == (long)((long)(name->m_ref).
                            super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                     name->m_slot_id) / 0x30) {
    lVar2 = lVar2 + 1;
    ppVar5 = (proxy *)0x0;
    lVar7 = 0;
    lVar6 = -0x30;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) goto LAB_0012bc53;
      lVar7 = lVar7 + 0x60;
      sVar3 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::count<std::__cxx11::string>
                        ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)((long)&((name->m_ref).
                                     super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->domain + lVar6),&in_RDX->m_id);
      lVar6 = lVar6 + -0x30;
    } while (sVar3 == 0);
    bVar1 = domain_type::exist((domain_type *)(*(long *)((long)&(name->m_id).field_2 + 8) - lVar7),
                               in_RDX);
    if (bVar1) {
      pvVar4 = domain_type::get_var_no_check
                         ((domain_type *)(*(long *)((long)&(name->m_id).field_2 + 8) - lVar7),in_RDX
                         );
      ppVar5 = pvVar4->mDat;
      if (ppVar5 != (proxy *)0x0) {
        ppVar5->refcount = ppVar5->refcount + 1;
        goto LAB_0012bc53;
      }
    }
    ppVar5 = (proxy *)0x0;
  }
  else {
    ppVar5 = (proxy *)0x0;
  }
LAB_0012bc53:
  this->fiber_stack = (stack_pointer *)ppVar5;
  return (var)(proxy *)this;
}

Assistant:

var get_var_optimizable(T &&name)
		{
			if (m_data.size() == m_set.size()) {
				for (std::size_t i = 0, size = m_data.size(); i < size; ++i) {
					if (m_set[i].count(name) > 0) {
						if (m_data[i].exist(name))
							return m_data[i].get_var_no_check(name);
						else
							break;
					}
				}
			}
			return var();
		}